

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_isBaseUnitImportReferenceUnresolved_Test::TestBody
          (Units_isBaseUnitImportReferenceUnresolved_Test *this)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  byte bVar4;
  AssertHelper local_90 [8];
  Message local_88 [8];
  char *local_80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  UnitsPtr u2;
  AssertionResult gtest_ar_;
  ImportSourcePtr import;
  UnitsPtr u1;
  ModelPtr model;
  
  libcellml::Model::create();
  peVar3 = model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"model",(allocator<char> *)&u1);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string((string *)&local_80);
  libcellml::Units::create();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"u",(allocator<char> *)&u2)
  ;
  libcellml::NamedEntity::setName
            ((string *)u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&local_80);
  libcellml::Units::create();
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"some_other_u",(allocator<char> *)&import);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&local_80);
  libcellml::ImportSource::create();
  peVar2 = import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"I_am_a_url",(allocator<char> *)&gtest_ar_);
  libcellml::ImportSource::setUrl((string *)peVar2);
  std::__cxx11::string::~string((string *)&local_80);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ImportedEntity::setImportSource
            ((shared_ptr *)
             (u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  libcellml::ImportSource::setModel
            ((shared_ptr *)
             import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  gtest_ar_.success_ = (bool)libcellml::ImportedEntity::isImport();
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_80,&gtest_ar_.success_,"u2->isImport()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x8db,local_80);
    testing::internal::AssertHelper::operator=(local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::ImportedEntity::importReference_abi_cxx11_();
  gtest_ar_.success_ =
       local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&local_80);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_80,&gtest_ar_.success_,"u2->importReference().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x8dc,local_80);
    testing::internal::AssertHelper::operator=(local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar4 = libcellml::Units::isBaseUnit();
  gtest_ar_.success_ = (bool)(bVar4 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar4 != 0) {
    testing::Message::Message(local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_80,&gtest_ar_.success_,"u2->isBaseUnit()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x8dd,local_80);
    testing::internal::AssertHelper::operator=(local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, isBaseUnitImportReferenceUnresolved)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u");
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("some_other_u");

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");

    model->addUnits(u1);

    u2->setImportSource(import);
    import->setModel(model);

    EXPECT_TRUE(u2->isImport());
    EXPECT_TRUE(u2->importReference().empty());
    EXPECT_FALSE(u2->isBaseUnit());
}